

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
pred_intersection(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
                 map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                 *nodes,int n,
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *dom)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  ulong uVar10;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> *local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  p_Var9 = &(nodes->_M_t)._M_impl.super__Rb_tree_header;
  p_Var4 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var9->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < n]) {
    if (n <= (int)p_Var4[1]._M_color) {
      p_Var6 = p_Var4;
    }
  }
  p_Var4 = &p_Var9->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var9) && (p_Var4 = p_Var6, n < (int)p_Var6[1]._M_color)) {
    p_Var4 = &p_Var9->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var9) {
LAB_001935e3:
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    p_Var6 = &(dom->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var7 = p_Var6;
    for (p_Var5 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < n]) {
      if (n <= (int)p_Var5[1]._M_color) {
        p_Var7 = p_Var5;
      }
    }
    p_Var4 = p_Var4[1]._M_parent;
    p_Var5 = p_Var6;
    if ((p_Var7 != p_Var6) && (p_Var5 = p_Var7, n < (int)p_Var7[1]._M_color)) {
      p_Var5 = p_Var6;
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&local_108,(vector<int,_std::allocator<int>_> *)&p_Var5[1]._M_parent);
    p_Var5 = p_Var4[1]._M_right;
    if (*(long *)(p_Var4 + 2) - (long)p_Var5 == 8) {
      p_Var4 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = p_Var6;
      if (p_Var4 != (_Base_ptr)0x0) {
        iVar1 = **(int **)p_Var5;
        do {
          if (iVar1 <= (int)p_Var4[1]._M_color) {
            p_Var7 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1];
        } while (p_Var4 != (_Base_ptr)0x0);
      }
      if ((p_Var7 != p_Var6) && ((int)p_Var7[1]._M_color <= **(int **)p_Var5)) {
        p_Var6 = p_Var7;
      }
      std::vector<int,_std::allocator<int>_>::vector(&local_60,&local_108);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,(vector<int,_std::allocator<int>_> *)&p_Var6[1]._M_parent);
      vectors_set_union(&local_128,&local_60,&local_78);
      piVar3 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      piVar2 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (piVar2 != (pointer)0x0) {
        operator_delete(piVar2,(long)piVar3 - (long)piVar2);
      }
      if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
    }
    else {
      if ((ulong)(*(long *)(p_Var4 + 2) - (long)p_Var5) < 9) {
        if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        goto LAB_001935e3;
      }
      p_Var7 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = p_Var6;
      if (p_Var7 != (_Base_ptr)0x0) {
        iVar1 = **(int **)p_Var5;
        do {
          if (iVar1 <= (int)p_Var7[1]._M_color) {
            p_Var8 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < iVar1];
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      p_Var7 = p_Var6;
      if ((p_Var8 != p_Var6) && (p_Var7 = p_Var8, **(int **)p_Var5 < (int)p_Var8[1]._M_color)) {
        p_Var7 = p_Var6;
      }
      local_c8 = __return_storage_ptr__;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_128,(vector<int,_std::allocator<int>_> *)&p_Var7[1]._M_parent);
      p_Var5 = p_Var4[1]._M_right;
      if (8 < (ulong)(*(long *)(p_Var4 + 2) - (long)p_Var5)) {
        uVar10 = 1;
        do {
          p_Var7 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = p_Var6;
          if (p_Var7 != (_Base_ptr)0x0) {
            iVar1 = **(int **)(&p_Var5->_M_color + uVar10 * 2);
            do {
              if (iVar1 <= (int)p_Var7[1]._M_color) {
                p_Var8 = p_Var7;
              }
              p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < iVar1];
            } while (p_Var7 != (_Base_ptr)0x0);
          }
          p_Var7 = p_Var6;
          if ((p_Var8 != p_Var6) &&
             (p_Var7 = p_Var8, **(int **)(&p_Var5->_M_color + uVar10 * 2) < (int)p_Var8[1]._M_color)
             ) {
            p_Var7 = p_Var6;
          }
          std::vector<int,_std::allocator<int>_>::vector(&local_90,&local_128);
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_48,(vector<int,_std::allocator<int>_> *)&p_Var7[1]._M_parent);
          vectors_intersection(&local_e8,&local_90,&local_48);
          piVar3 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          piVar2 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          if (piVar2 != (pointer)0x0) {
            operator_delete(piVar2,(long)piVar3 - (long)piVar2);
          }
          if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          uVar10 = uVar10 + 1;
          p_Var5 = p_Var4[1]._M_right;
        } while (uVar10 < (ulong)(*(long *)(p_Var4 + 2) - (long)p_Var5 >> 3));
      }
      std::vector<int,_std::allocator<int>_>::vector(&local_a8,&local_108);
      std::vector<int,_std::allocator<int>_>::vector(&local_c0,&local_128);
      __return_storage_ptr__ = local_c8;
      vectors_set_union(local_c8,&local_a8,&local_c0);
      if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> pred_intersection(map<int, BasicBlock*> nodes, int n,
                              map<int, vector<int>> dom) {
  // intersect dom of all direct precursor nodes of n and merged with dom of n
  map<int, BasicBlock*>::iterator it = nodes.find(n);
  // cout << "$$" << n << endl;
  if (it != nodes.end()) {
    BasicBlock* b = it->second;
    map<int, vector<int>>::iterator iter = dom.find(n);
    vector<int> v1 = iter->second;
    // cout << "$$" << b->preBlock.size() << endl;
    if (b->preBlock.size() == 1) {
      iter = dom.find(b->preBlock[0]->id);
      v1 = vectors_set_union(v1, iter->second);
      // cout << b->id << "**" << v1[0] << endl;
      return v1;
    } else if (b->preBlock.size() >= 2) {
      iter = dom.find(b->preBlock[0]->id);
      vector<int> v2 = iter->second;
      for (int i = 1; i < b->preBlock.size(); i++) {
        iter = dom.find(b->preBlock[i]->id);
        v2 = vectors_intersection(v2, iter->second);
      }
      return vectors_set_union(v1, v2);
    } else {
      // error
    }
  }
  vector<int> v;
  return v;
}